

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O0

Msg * __thiscall util::logging::Msg::getMsg_txt_abi_cxx11_(Msg *this)

{
  long in_RSI;
  Msg *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 8));
  return this;
}

Assistant:

std::string Msg::getMsg_txt() const
		{
			return msg_txt;
		}